

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void glfwSwapBuffers(GLFWwindow *handle)

{
  char *format;
  int code;
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/glfw-src/src/context.c"
                  ,0x286,"void glfwSwapBuffers(GLFWwindow *)");
  }
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (*(int *)(handle + 0x1f8) != 0) {
      (**(code **)(handle + 0x248))();
      return;
    }
    format = "Cannot swap buffers of a window that has no OpenGL or OpenGL ES context";
    code = 0x1000a;
  }
  _glfwInputError(code,format);
  return;
}

Assistant:

GLFWAPI void glfwSwapBuffers(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT,
                        "Cannot swap buffers of a window that has no OpenGL or OpenGL ES context");
        return;
    }

    window->context.swapBuffers(window);
}